

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance_test_image_function.cpp
# Opt level: O3

pair<double,_double>
Function_Template::template_Threshold(ThresholdForm2 Threshold,string *namespaceName,uint32_t size)

{
  int iVar1;
  uint32_t uVar2;
  uint32_t i;
  uint uVar3;
  pair<double,_double> pVar4;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  image;
  TimerContainer timer;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  local_60;
  TimerContainer local_48;
  
  Test_Helper::uniformImages(&local_60,2,size,size);
  iVar1 = rand();
  SetupFunction(namespaceName);
  Performance_Test::TimerContainer::TimerContainer(&local_48);
  uVar3 = 0;
  while( true ) {
    uVar2 = Test_Helper::runCount();
    if (uVar2 <= uVar3) break;
    Performance_Test::TimerContainer::start(&local_48);
    (*Threshold)(local_60.
                 super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 local_60.
                 super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1,(uint8_t)iVar1);
    Performance_Test::TimerContainer::stop(&local_48);
    uVar3 = uVar3 + 1;
  }
  CleanupFunction(namespaceName);
  pVar4 = Performance_Test::BaseTimerContainer::mean(&local_48.super_BaseTimerContainer);
  Performance_Test::TimerContainer::~TimerContainer(&local_48);
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::~vector(&local_60);
  return pVar4;
}

Assistant:

std::pair < double, double > template_Threshold( ThresholdForm2 Threshold, const std::string & namespaceName, uint32_t size )
    {
        std::vector < PenguinV_Image::Image > image = Performance_Test::uniformImages( 2, size, size );
        uint8_t threshold = Performance_Test::randomValue<uint8_t>( 256 );

        TEST_FUNCTION_LOOP( Threshold( image[0], image[1], threshold ), namespaceName )
    }